

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

precise_unit units::get_unit(string *unit_string,uint64_t match_flags)

{
  precise_unit actUnit;
  precise_unit actUnit_00;
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  size_t *index_00;
  pointer pvVar4;
  const_reference pvVar5;
  size_type sVar6;
  char *pcVar7;
  long lVar8;
  uint64_t in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  precise_unit pVar9;
  uint16_t num_2;
  char *ptr_2;
  uint16_t num_1;
  char *ptr_1;
  uint16_t num;
  char *ptr;
  size_t index;
  value_type c;
  const_iterator fnd;
  uint64_t cdomain;
  iterator fnd2;
  precise_unit dmunit;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
  *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  atomic<bool> *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  unit_data in_stack_ffffffffffffff44;
  char *in_stack_ffffffffffffff48;
  size_type in_stack_ffffffffffffff50;
  undefined6 in_stack_ffffffffffffff58;
  undefined2 in_stack_ffffffffffffff5e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  char *pcVar10;
  undefined1 in_stack_ffffffffffffff68 [16];
  char *local_80;
  precise_unit local_78;
  undefined2 local_62;
  char *local_60;
  undefined8 local_58;
  char local_49;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
  local_48;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
  local_40;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
  in_stack_ffffffffffffffd0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
  in_stack_ffffffffffffffd8;
  precise_unit local_10;
  
  bVar1 = std::atomic<bool>::load
                    (in_stack_ffffffffffffff38,
                     (memory_order)((ulong)in_stack_ffffffffffffff30 >> 0x20));
  if ((bVar1) &&
     (bVar1 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
              ::empty((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
                       *)0x7331dd), !bVar1)) {
    in_stack_ffffffffffffffd8._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
         ::find(in_stack_ffffffffffffff28,(key_type *)0x7331f5);
    in_stack_ffffffffffffffd0._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
         ::end(in_stack_ffffffffffffff28);
    bVar1 = std::__detail::operator==
                      ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
                        *)&stack0xffffffffffffffd8,
                       (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
                        *)&stack0xffffffffffffffd0);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_false,_true>
                             *)0x73323b);
      return ppVar3->second;
    }
  }
  index_00 = (size_t *)getCurrentDomain(in_RSI);
  if (index_00 != (size_t *)0x0) {
    pVar9 = getDomainUnit((uint64_t)in_stack_ffffffffffffff48,
                          (string *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    bVar1 = is_valid((precise_unit *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    if (bVar1) {
      return pVar9;
    }
  }
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
       ::find(in_stack_ffffffffffffff28,(key_type *)0x7332d0);
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
       ::end(in_stack_ffffffffffffff28);
  bVar1 = std::__detail::operator==(&local_40,&local_48);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    pvVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             front(in_stack_ffffffffffffff30);
    local_49 = *pvVar5;
    if (((local_49 == 'C') || (local_49 == 'E')) &&
       (sVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::size(in_RDI), 5 < sVar6)) {
      local_58 = 0;
      iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(in_stack_ffffffffffffff60,
                      CONCAT26(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58),
                      in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      if ((iVar2 == 0) &&
         (bVar1 = hasAdditionalOps((string *)
                                   CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)),
         !bVar1)) {
        local_60 = (char *)0x0;
        pcVar7 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            0x7333db);
        lVar8 = strtol(pcVar7 + 5,&local_60,0);
        local_62 = (undefined2)lVar8;
        if (*local_60 == ']') {
          local_78 = precise::generate_custom_unit(0);
          pVar9.base_units_ = (unit_data)(int)in_RSI;
          pVar9.commodity_ = (int)(in_RSI >> 0x20);
          pVar9.multiplier_ = (double)in_stack_ffffffffffffffd8._M_cur;
          pVar9 = commoditizedUnit((string *)in_stack_ffffffffffffffd0._M_cur,pVar9,index_00);
          return pVar9;
        }
      }
      iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(in_stack_ffffffffffffff60,
                      CONCAT26(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58),
                      in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      if ((iVar2 == 0) &&
         (bVar1 = hasAdditionalOps((string *)
                                   CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)),
         !bVar1)) {
        local_80 = (char *)0x0;
        pcVar7 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            0x7334aa);
        strtol(pcVar7 + 6,&local_80,0);
        if (*local_80 == ']') {
          precise::generate_custom_count_unit(0);
          actUnit.base_units_ = (unit_data)(int)in_RSI;
          actUnit.commodity_ = (int)(in_RSI >> 0x20);
          actUnit.multiplier_ = (double)in_stack_ffffffffffffffd8._M_cur;
          pVar9 = commoditizedUnit((string *)in_stack_ffffffffffffffd0._M_cur,actUnit,index_00);
          return pVar9;
        }
      }
      iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(in_stack_ffffffffffffff60,
                      CONCAT26(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58),
                      in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      if ((iVar2 == 0) &&
         (bVar1 = hasAdditionalOps((string *)
                                   CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)),
         !bVar1)) {
        pcVar10 = (char *)0x0;
        pcVar7 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            0x733579);
        strtol(pcVar7 + 6,(char **)&stack0xffffffffffffff60,0);
        if (*pcVar10 == ']') {
          precise::custom::equation_unit(in_stack_ffffffffffffff68._10_2_);
          precise_unit::precise_unit
                    ((precise_unit *)&stack0xffffffffffffff48,(unit_data *)&stack0xffffffffffffff44)
          ;
          actUnit_00.base_units_ = (unit_data)(int)in_RSI;
          actUnit_00.commodity_ = (int)(in_RSI >> 0x20);
          actUnit_00.multiplier_ = (double)in_stack_ffffffffffffffd8._M_cur;
          pVar9 = commoditizedUnit((string *)in_stack_ffffffffffffffd0._M_cur,actUnit_00,index_00);
          return pVar9;
        }
      }
    }
    local_10.base_units_ = (unit_data)0xfa94a488;
    local_10.commodity_ = 0;
    local_10.multiplier_ = NAN;
  }
  else {
    pvVar4 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_false,_true>
                           *)0x733316);
    local_10 = pvVar4->second;
  }
  return local_10;
}

Assistant:

static precise_unit
    get_unit(const std::string& unit_string, std::uint64_t match_flags)
{
    if (allowUserDefinedUnits.load(std::memory_order_acquire)) {
        if (!user_defined_units.empty()) {
            auto fnd2 = user_defined_units.find(unit_string);
            if (fnd2 != user_defined_units.end()) {
                return fnd2->second;
            }
        }
    }

    auto cdomain = getCurrentDomain(match_flags);
    if (cdomain != domains::defaultDomain) {
        auto dmunit = getDomainUnit(cdomain, unit_string);
        if (is_valid(dmunit)) {
            return dmunit;
        }
    }

    auto fnd = base_unit_vals.find(unit_string);
    if (fnd != base_unit_vals.end()) {
        return fnd->second;
    }
    // empty string would have been found already
    auto c = unit_string.front();
    if ((c == 'C' || c == 'E') && unit_string.size() >= 6) {
        size_t index{0};
        if (unit_string.compare(0, 5, "CXUN[") == 0) {
            if (!hasAdditionalOps(unit_string)) {
                char* ptr = nullptr;
                auto num = static_cast<std::uint16_t>(
                    strtol(unit_string.c_str() + 5, &ptr, 0));
                if (*ptr == ']') {
                    return commoditizedUnit(
                        unit_string, precise::generate_custom_unit(num), index);
                }
            }
        }
        if (unit_string.compare(0, 6, "CXCUN[") == 0) {
            if (!hasAdditionalOps(unit_string)) {
                char* ptr = nullptr;
                auto num = static_cast<std::uint16_t>(
                    strtol(unit_string.c_str() + 6, &ptr, 0));
                if (*ptr == ']') {
                    return commoditizedUnit(
                        unit_string,
                        precise::generate_custom_count_unit(num),
                        index);
                }
            }
        }
        if (unit_string.compare(0, 6, "EQXUN[") == 0) {
            if (!hasAdditionalOps(unit_string)) {
                char* ptr = nullptr;
                auto num = static_cast<std::uint16_t>(
                    strtol(unit_string.c_str() + 6, &ptr, 0));
                if (*ptr == ']') {
                    return commoditizedUnit(
                        unit_string,
                        precise_unit(precise::custom::equation_unit(num)),
                        index);
                }
            }
        }
    }
    return precise::invalid;
}